

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::TempDir_abi_cxx11_(void)

{
  string *in_RDI;
  char in_stack_00000077;
  char *in_stack_00000078;
  undefined1 in_stack_00000080 [16];
  char *local_28;
  char *local_20;
  char **local_18;
  undefined8 local_10;
  
  local_28 = "TEST_TMPDIR";
  local_20 = "TMPDIR";
  local_18 = &local_28;
  local_10 = 2;
  GetDirFromEnv_abi_cxx11_
            ((initializer_list<const_char_*>)in_stack_00000080,in_stack_00000078,in_stack_00000077);
  return in_RDI;
}

Assistant:

std::string TempDir() {
#if defined(GTEST_CUSTOM_TEMPDIR_FUNCTION_)
  return GTEST_CUSTOM_TEMPDIR_FUNCTION_();
#elif defined(GTEST_OS_WINDOWS) || defined(GTEST_OS_WINDOWS_MOBILE)
  return GetDirFromEnv({"TEST_TMPDIR", "TEMP"}, "\\temp\\", '\\');
#elif defined(GTEST_OS_LINUX_ANDROID)
  return GetDirFromEnv({"TEST_TMPDIR", "TMPDIR"}, "/data/local/tmp/", '/');
#else
  return GetDirFromEnv({"TEST_TMPDIR", "TMPDIR"}, "/tmp/", '/');
#endif
}